

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Alias::~Alias(Alias *this)

{
  capnp::_::OrphanBuilder::~OrphanBuilder(&(this->brandOrphan).builder);
  if (((this->target).ptr.isSet == true) && ((this->target).ptr.field_1.value.tag - 1 < 2)) {
    (this->target).ptr.field_1.value.tag = 0;
  }
  return;
}

Assistant:

Alias(CompiledModule& module, Node& parent, const Expression::Reader& targetName)
      : module(module), parent(parent), targetName(targetName) {}